

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,FixedArray<char,_1UL> *params,
          FixedArray<char,_1UL> *params_1,FixedArray<char,_1UL> *params_2)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  size_t result_2;
  String local_68;
  long local_48 [4];
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_68.content.ptr = (char *)0x1;
  local_68.content.size_ = 1;
  local_68.content.disposer = (ArrayDisposer *)0x1;
  sVar3 = 0;
  lVar5 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_68.content.ptr + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  __return_storage_ptr__->size_ = sVar3;
  local_48[0] = 1;
  local_48[1] = 1;
  local_48[2] = 1;
  sVar3 = 0;
  lVar5 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_48 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  heapString(&local_68,sVar3);
  pcVar4 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar4,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_68.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_68.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_68.content.disposer;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  sVar3 = 0;
  lVar5 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_48 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  local_68.content.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_68.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_68.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_68.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_68.content.size_;
  (__return_storage_ptr__->branches).disposer = local_68.content.disposer;
  pcVar4 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->text).content.ptr;
  }
  *pcVar4 = (char)this->size_;
  pcVar4[1] = params->content[0];
  pcVar4[2] = params_1->content[0];
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}